

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

bool __thiscall Hpipe::Lexer::assemble_barg(Lexer *this,Lexem *o,int need_left,int need_right)

{
  int need_right_local;
  int need_left_local;
  Lexem *o_local;
  Lexer *this_local;
  
  if ((need_right == 0) || (o->next != (Lexem *)0x0)) {
    if ((need_left == 0) || (o->prev != (Lexem *)0x0)) {
      if (o->prev->parent != (Lexem *)0x0) {
        o->parent = o->prev->parent;
        if (o->prev->parent->children[0] == o->prev) {
          o->prev->parent->children[0] = o;
        }
        else {
          o->prev->parent->children[1] = o;
        }
      }
      if (o->prev->prev != (Lexem *)0x0) {
        o->prev->prev->next = o;
      }
      o->children[0] = o->prev;
      o->children[0]->parent = o;
      o->prev = o->prev->prev;
      o->children[0]->next = (Lexem *)0x0;
      o->children[0]->prev = (Lexem *)0x0;
      if (o->next->next != (Lexem *)0x0) {
        o->next->next->prev = o;
      }
      o->children[1] = o->next;
      o->children[1]->parent = o;
      o->next = o->next->next;
      o->children[1]->prev = (Lexem *)0x0;
      o->children[1]->next = (Lexem *)0x0;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = err(this,o,"Operator needs a left expression.");
    }
  }
  else {
    this_local._7_1_ = err(this,o,"Operator needs a right expression.");
  }
  return this_local._7_1_;
}

Assistant:

bool Lexer::assemble_barg( Lexem *o, int need_left, int need_right ) {
    if ( need_right and not o->next )
        return err( o, "Operator needs a right expression." );
    if ( need_left and not o->prev )
        return err( o, "Operator needs a left expression." );
    // prev
    if ( o->prev->parent ) {
        o->parent = o->prev->parent;
        if (o->prev->parent->children[ 0 ] == o->prev)
            o->prev->parent->children[ 0 ] = o;
        else
            o->prev->parent->children[ 1 ] = o;
    }
    if ( o->prev->prev )
        o->prev->prev->next = o;

    o->children[ 0 ] = o->prev;
    o->children[ 0 ]->parent = o;
    o->prev = o->prev->prev;

    o->children[ 0 ]->next = NULL;
    o->children[ 0 ]->prev = NULL;

    // next
    if ( o->next->next )
        o->next->next->prev = o;

    o->children[ 1 ] = o->next;
    o->children[ 1 ]->parent = o;
    o->next = o->next->next;

    o->children[ 1 ]->prev = NULL;
    o->children[ 1 ]->next = NULL;

    return true;
}